

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFileTests.cc
# Opt level: O2

void __thiscall DataFileTest::testWriteGenericByName(DataFileTest *this)

{
  GenericRecord *this_00;
  GenericDatum *pGVar1;
  size_t __n;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  long v;
  long v_00;
  allocator<char> local_89;
  DataFileWriter<std::pair<avro::ValidSchema,_avro::GenericDatum>_> df;
  GenericDatum local_80;
  Pair p;
  string local_50;
  
  __n = 100;
  avro::DataFileWriter<std::pair<avro::ValidSchema,_avro::GenericDatum>_>::DataFileWriter
            (&df,this->filename,&this->writerSchema,100,NULL_CODEC);
  p.first.root_.px = (this->writerSchema).root_.px;
  p.first.root_.pn.pi_ = (this->writerSchema).root_.pn.pi_;
  if (p.first.root_.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (p.first.root_.pn.pi_)->use_count_ = (p.first.root_.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  p.second.type_ = AVRO_NULL;
  p.second.value_.content = (placeholder *)0x0;
  avro::GenericDatum::GenericDatum((GenericDatum *)&local_50,(shared_ptr *)&this->writerSchema);
  avro::GenericDatum::operator=(&p.second,(GenericDatum *)&local_50);
  if ((long *)local_50._M_string_length != (long *)0x0) {
    (**(code **)(*(long *)local_50._M_string_length + 8))();
  }
  this_00 = boost::any_cast<avro::GenericRecord>(&p.second.value_);
  v = 3;
  for (v_00 = 5; (int)v_00 != 0xbbd; v_00 = v_00 + 3) {
    avro::GenericDatum::GenericDatum(&local_80,v);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"re",&local_89);
    pGVar1 = avro::GenericRecord::field(this_00,&local_50);
    avro::GenericDatum::operator=(pGVar1,&local_80);
    std::__cxx11::string::~string((string *)&local_50);
    if (local_80.value_.content != (placeholder *)0x0) {
      (*(local_80.value_.content)->_vptr_placeholder[1])();
    }
    avro::GenericDatum::GenericDatum(&local_80,v_00);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"im",&local_89);
    pGVar1 = avro::GenericRecord::field(this_00,&local_50);
    avro::GenericDatum::operator=(pGVar1,&local_80);
    std::__cxx11::string::~string((string *)&local_50);
    __buf = extraout_RDX;
    if (local_80.value_.content != (placeholder *)0x0) {
      (*(local_80.value_.content)->_vptr_placeholder[1])();
      __buf = extraout_RDX_00;
    }
    avro::DataFileWriter<std::pair<avro::ValidSchema,_avro::GenericDatum>_>::write
              (&df,(int)&p,__buf,__n);
    v = v * v_00;
  }
  avro::DataFileWriterBase::close();
  std::pair<avro::ValidSchema,_avro::GenericDatum>::~pair(&p);
  std::auto_ptr<avro::DataFileWriterBase>::~auto_ptr(&df.base_);
  return;
}

Assistant:

void testWriteGenericByName() {
        avro::DataFileWriter<Pair> df(filename, writerSchema, 100);
        int64_t re = 3;
        int64_t im = 5;
        Pair p(writerSchema, GenericDatum());

        GenericDatum& c = p.second;
        c = GenericDatum(writerSchema.root());
        GenericRecord& r = c.value<GenericRecord>();

        for (int i = 0; i < count; ++i, re *= im, im += 3) {
            r.field("re") = re;
            r.field("im") = im;
            df.write(p);
        }
        df.close();
    }